

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Constructor::Dynamic_Object_Constructor
          (Dynamic_Object_Constructor *this,string *t_type_name,Proxy_Function *t_func)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *tl;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_38;
  __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_20;
  Proxy_Function *t_func_local;
  string *t_type_name_local;
  Dynamic_Object_Constructor *this_local;
  
  local_20 = (__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)t_func;
  t_func_local = (Proxy_Function *)t_type_name;
  t_type_name_local = (string *)this;
  peVar3 = std::
           __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)t_func);
  tl = Proxy_Function_Base::get_param_types(peVar3);
  build_type_list(&local_38,tl);
  peVar3 = std::
           __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_20);
  iVar2 = Proxy_Function_Base::get_arity(peVar3);
  Proxy_Function_Base::Proxy_Function_Base(&this->super_Proxy_Function_Base,&local_38,iVar2 + -1);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector(&local_38);
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Dynamic_Object_Constructor_008894f0;
  std::__cxx11::string::string((string *)&this->m_type_name,t_type_name);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::shared_ptr
            (&this->m_func,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_20);
  peVar3 = std::
           __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_20);
  iVar2 = Proxy_Function_Base::get_arity(peVar3);
  if (iVar2 < 1) {
    peVar3 = std::
             __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_20);
    iVar2 = Proxy_Function_Base::get_arity(peVar3);
    bVar1 = false;
    if (-1 < iVar2) goto LAB_0074e2d3;
  }
  bVar1 = true;
LAB_0074e2d3:
  if (!bVar1) {
    __assert_fail("(t_func->get_arity() > 0 || t_func->get_arity() < 0) && \"Programming error, Dynamic_Object_Function must have at least one parameter (this)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/static_libs/../include/chaiscript/language/../dispatchkit/dynamic_object_detail.hpp"
                  ,0x9f,
                  "chaiscript::dispatch::detail::Dynamic_Object_Constructor::Dynamic_Object_Constructor(std::string, const Proxy_Function &)"
                 );
  }
  return;
}

Assistant:

Dynamic_Object_Constructor(std::string t_type_name, const Proxy_Function &t_func)
            : Proxy_Function_Base(build_type_list(t_func->get_param_types()), t_func->get_arity() - 1)
            , m_type_name(std::move(t_type_name))
            , m_func(t_func) {
          assert((t_func->get_arity() > 0 || t_func->get_arity() < 0)
                 && "Programming error, Dynamic_Object_Function must have at least one parameter (this)");
        }